

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar23;
  long lVar24;
  ulong unaff_R13;
  size_t mask;
  long lVar25;
  byte bVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar29 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  float fVar53;
  undefined1 auVar54 [32];
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar55 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 in_ZMM8 [64];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  byte local_2678;
  undefined1 local_2648 [16];
  ulong local_2638;
  ulong local_2630;
  ulong local_2628;
  ulong local_2620;
  Scene *local_2618;
  ulong local_2610;
  RTCFilterFunctionNArguments args;
  float local_2588 [4];
  float local_2578 [4];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  pSVar23 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar69 = ZEXT3264(auVar42);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar70 = ZEXT3264(auVar43);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar71 = ZEXT3264(auVar44);
  auVar29 = vmulss_avx512f(auVar42._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar49 = auVar29._0_4_;
  auVar42._4_4_ = uVar49;
  auVar42._0_4_ = uVar49;
  auVar42._8_4_ = uVar49;
  auVar42._12_4_ = uVar49;
  auVar42._16_4_ = uVar49;
  auVar42._20_4_ = uVar49;
  auVar42._24_4_ = uVar49;
  auVar42._28_4_ = uVar49;
  auVar29 = vmulss_avx512f(auVar43._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar49 = auVar29._0_4_;
  auVar43._4_4_ = uVar49;
  auVar43._0_4_ = uVar49;
  auVar43._8_4_ = uVar49;
  auVar43._12_4_ = uVar49;
  auVar43._16_4_ = uVar49;
  auVar43._20_4_ = uVar49;
  auVar43._24_4_ = uVar49;
  auVar43._28_4_ = uVar49;
  auVar29 = vmulss_avx512f(auVar44._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar49 = auVar29._0_4_;
  auVar44._4_4_ = uVar49;
  auVar44._0_4_ = uVar49;
  auVar44._8_4_ = uVar49;
  auVar44._12_4_ = uVar49;
  auVar44._16_4_ = uVar49;
  auVar44._20_4_ = uVar49;
  auVar44._24_4_ = uVar49;
  auVar44._28_4_ = uVar49;
  local_2620 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2628 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2630 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2638 = local_2620 ^ 0x20;
  uVar20 = local_2628 ^ 0x20;
  local_2610 = local_2630 ^ 0x20;
  iVar17 = (tray->tfar).field_0.i[k];
  auVar52 = ZEXT3264(CONCAT428(iVar17,CONCAT424(iVar17,CONCAT420(iVar17,CONCAT416(iVar17,CONCAT412(
                                                  iVar17,CONCAT48(iVar17,CONCAT44(iVar17,iVar17)))))
                                               )));
  auVar45._8_4_ = 0x80000000;
  auVar45._0_8_ = 0x8000000080000000;
  auVar45._12_4_ = 0x80000000;
  auVar45._16_4_ = 0x80000000;
  auVar45._20_4_ = 0x80000000;
  auVar45._24_4_ = 0x80000000;
  auVar45._28_4_ = 0x80000000;
  auVar42 = vxorps_avx512vl(auVar42,auVar45);
  auVar72 = ZEXT3264(auVar42);
  auVar42 = vxorps_avx512vl(auVar43,auVar45);
  auVar73 = ZEXT3264(auVar42);
  auVar42 = vxorps_avx512vl(auVar44,auVar45);
  auVar74 = ZEXT3264(auVar42);
  auVar42 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar75 = ZEXT3264(auVar42);
  auVar29 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar76 = ZEXT1664(auVar29);
  auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar77 = ZEXT3264(auVar42);
  auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar78 = ZEXT3264(auVar42);
  auVar29 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar79 = ZEXT1664(auVar29);
  auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar80 = ZEXT3264(auVar42);
  auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
  auVar81 = ZEXT3264(auVar42);
  uVar19 = local_2610;
  do {
    do {
      do {
        if (pSVar23 == stack) {
          return;
        }
        pSVar16 = pSVar23 + -1;
        pSVar23 = pSVar23 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar16->dist);
      sVar22 = (pSVar23->ptr).ptr;
      do {
        if ((sVar22 & 8) == 0) {
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar22 + 0x40 + local_2620),auVar72._0_32_,
                               auVar69._0_32_);
          auVar43 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar22 + 0x40 + local_2628),auVar73._0_32_,
                               auVar70._0_32_);
          auVar42 = vpmaxsd_avx2(auVar42,auVar43);
          auVar43 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar22 + 0x40 + local_2630),auVar74._0_32_,
                               auVar71._0_32_);
          auVar43 = vpmaxsd_avx512vl(auVar43,auVar75._0_32_);
          auVar42 = vpmaxsd_avx2(auVar42,auVar43);
          in_ZMM8 = ZEXT3264(auVar42);
          auVar43 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar22 + 0x40 + local_2638),auVar72._0_32_,
                               auVar69._0_32_);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar22 + 0x40 + uVar20),auVar73._0_32_,
                               auVar70._0_32_);
          auVar43 = vpminsd_avx2(auVar43,auVar44);
          auVar44 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar22 + 0x40 + uVar19),auVar74._0_32_,
                               auVar71._0_32_);
          auVar44 = vpminsd_avx2(auVar44,auVar52._0_32_);
          auVar43 = vpminsd_avx2(auVar43,auVar44);
          uVar11 = vpcmpd_avx512vl(auVar42,auVar43,2);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)(byte)uVar11);
        }
        if ((sVar22 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar17 = 4;
          }
          else {
            auVar42 = *(undefined1 (*) [32])(sVar22 & 0xfffffffffffffff0);
            auVar43 = ((undefined1 (*) [32])(sVar22 & 0xfffffffffffffff0))[1];
            auVar44 = vmovdqa64_avx512vl(auVar77._0_32_);
            auVar63 = in_ZMM8._0_32_;
            auVar44 = vpternlogd_avx512vl(auVar44,auVar63,auVar78._0_32_,0xf8);
            uVar27 = unaff_R13 & 0xffffffff;
            auVar45 = vpcompressd_avx512vl(auVar44);
            bVar6 = (bool)((byte)uVar27 & 1);
            auVar47._0_4_ = (uint)bVar6 * auVar45._0_4_ | (uint)!bVar6 * auVar44._0_4_;
            bVar6 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
            bVar6 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
            bVar6 = (bool)((byte)(uVar27 >> 3) & 1);
            auVar47._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
            bVar6 = (bool)((byte)(uVar27 >> 4) & 1);
            auVar47._16_4_ = (uint)bVar6 * auVar45._16_4_ | (uint)!bVar6 * auVar44._16_4_;
            bVar6 = (bool)((byte)(uVar27 >> 5) & 1);
            auVar47._20_4_ = (uint)bVar6 * auVar45._20_4_ | (uint)!bVar6 * auVar44._20_4_;
            bVar6 = (bool)((byte)(uVar27 >> 6) & 1);
            auVar47._24_4_ = (uint)bVar6 * auVar45._24_4_ | (uint)!bVar6 * auVar44._24_4_;
            bVar6 = (bool)((byte)(uVar27 >> 7) & 1);
            auVar47._28_4_ = (uint)bVar6 * auVar45._28_4_ | (uint)!bVar6 * auVar44._28_4_;
            auVar44 = vpermt2q_avx512vl(auVar42,auVar47,auVar43);
            sVar22 = auVar44._0_8_;
            iVar17 = 0;
            uVar27 = unaff_R13 - 1 & unaff_R13;
            if (uVar27 != 0) {
              auVar44 = vpshufd_avx2(auVar47,0x55);
              vpermt2q_avx512vl(auVar42,auVar44,auVar43);
              auVar45 = vpminsd_avx2(auVar47,auVar44);
              auVar44 = vpmaxsd_avx2(auVar47,auVar44);
              uVar27 = uVar27 - 1 & uVar27;
              if (uVar27 == 0) {
                auVar45 = vpermi2q_avx512vl(auVar45,auVar42,auVar43);
                sVar22 = auVar45._0_8_;
                auVar42 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                (pSVar23->ptr).ptr = auVar42._0_8_;
                auVar42 = vpermd_avx2(auVar44,auVar63);
                pSVar23->dist = auVar42._0_4_;
                pSVar23 = pSVar23 + 1;
              }
              else {
                auVar54 = vpshufd_avx2(auVar47,0xaa);
                vpermt2q_avx512vl(auVar42,auVar54,auVar43);
                auVar48 = vpminsd_avx2(auVar45,auVar54);
                auVar45 = vpmaxsd_avx2(auVar45,auVar54);
                auVar54 = vpminsd_avx2(auVar44,auVar45);
                auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                uVar27 = uVar27 - 1 & uVar27;
                if (uVar27 == 0) {
                  auVar45 = vpermi2q_avx512vl(auVar48,auVar42,auVar43);
                  sVar22 = auVar45._0_8_;
                  auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                  (pSVar23->ptr).ptr = auVar45._0_8_;
                  auVar44 = vpermd_avx2(auVar44,auVar63);
                  pSVar23->dist = auVar44._0_4_;
                  auVar42 = vpermt2q_avx512vl(auVar42,auVar54,auVar43);
                  pSVar23[1].ptr.ptr = auVar42._0_8_;
                  auVar42 = vpermd_avx2(auVar54,auVar63);
                  pSVar23[1].dist = auVar42._0_4_;
                  pSVar23 = pSVar23 + 2;
                }
                else {
                  auVar45 = vpshufd_avx2(auVar47,0xff);
                  vpermt2q_avx512vl(auVar42,auVar45,auVar43);
                  auVar7 = vpminsd_avx2(auVar48,auVar45);
                  auVar45 = vpmaxsd_avx2(auVar48,auVar45);
                  auVar48 = vpminsd_avx2(auVar54,auVar45);
                  auVar45 = vpmaxsd_avx2(auVar54,auVar45);
                  auVar54 = vpminsd_avx2(auVar44,auVar45);
                  auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                  uVar27 = uVar27 - 1 & uVar27;
                  if (uVar27 == 0) {
                    auVar45 = vpermi2q_avx512vl(auVar7,auVar42,auVar43);
                    sVar22 = auVar45._0_8_;
                    auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                    (pSVar23->ptr).ptr = auVar45._0_8_;
                    in_ZMM8 = ZEXT3264(auVar63);
                    auVar44 = vpermd_avx2(auVar44,auVar63);
                    pSVar23->dist = auVar44._0_4_;
                    auVar44 = vpermt2q_avx512vl(auVar42,auVar54,auVar43);
                    pSVar23[1].ptr.ptr = auVar44._0_8_;
                    auVar44 = vpermd_avx2(auVar54,auVar63);
                    pSVar23[1].dist = auVar44._0_4_;
                    auVar42 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                    pSVar23[2].ptr.ptr = auVar42._0_8_;
                    auVar42 = vpermd_avx2(auVar48,auVar63);
                    pSVar23[2].dist = auVar42._0_4_;
                    pSVar23 = pSVar23 + 3;
                  }
                  else {
                    auVar46 = valignd_avx512vl(auVar47,auVar47,3);
                    auVar45 = vmovdqa64_avx512vl(auVar79._0_32_);
                    auVar45 = vpermt2d_avx512vl(auVar45,auVar80._0_32_,auVar7);
                    auVar45 = vpermt2d_avx512vl(auVar45,auVar81._0_32_,auVar48);
                    auVar47 = vpermt2d_avx512vl(auVar45,auVar81._0_32_,auVar54);
                    auVar45 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar44 = vpermt2d_avx512vl(auVar47,auVar45,auVar44);
                    auVar55 = ZEXT3264(auVar44);
                    uVar21 = uVar27;
                    do {
                      auVar45 = auVar55._0_32_;
                      auVar54._8_4_ = 1;
                      auVar54._0_8_ = 0x100000001;
                      auVar54._12_4_ = 1;
                      auVar54._16_4_ = 1;
                      auVar54._20_4_ = 1;
                      auVar54._24_4_ = 1;
                      auVar54._28_4_ = 1;
                      auVar44 = vpermd_avx2(auVar54,auVar46);
                      auVar46 = valignd_avx512vl(auVar46,auVar46,1);
                      vpermt2q_avx512vl(auVar42,auVar46,auVar43);
                      uVar21 = uVar21 - 1 & uVar21;
                      uVar11 = vpcmpd_avx512vl(auVar44,auVar45,5);
                      auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                      bVar26 = (byte)uVar11 << 1;
                      auVar45 = valignd_avx512vl(auVar45,auVar45,7);
                      bVar6 = (bool)((byte)uVar11 & 1);
                      auVar48._4_4_ = (uint)bVar6 * auVar45._4_4_ | (uint)!bVar6 * auVar44._4_4_;
                      auVar48._0_4_ = auVar44._0_4_;
                      bVar6 = (bool)(bVar26 >> 2 & 1);
                      auVar48._8_4_ = (uint)bVar6 * auVar45._8_4_ | (uint)!bVar6 * auVar44._8_4_;
                      bVar6 = (bool)(bVar26 >> 3 & 1);
                      auVar48._12_4_ = (uint)bVar6 * auVar45._12_4_ | (uint)!bVar6 * auVar44._12_4_;
                      bVar6 = (bool)(bVar26 >> 4 & 1);
                      auVar48._16_4_ = (uint)bVar6 * auVar45._16_4_ | (uint)!bVar6 * auVar44._16_4_;
                      bVar6 = (bool)(bVar26 >> 5 & 1);
                      auVar48._20_4_ = (uint)bVar6 * auVar45._20_4_ | (uint)!bVar6 * auVar44._20_4_;
                      bVar6 = (bool)(bVar26 >> 6 & 1);
                      auVar48._24_4_ = (uint)bVar6 * auVar45._24_4_ | (uint)!bVar6 * auVar44._24_4_;
                      auVar48._28_4_ =
                           (uint)(bVar26 >> 7) * auVar45._28_4_ |
                           (uint)!(bool)(bVar26 >> 7) * auVar44._28_4_;
                      auVar55 = ZEXT3264(auVar48);
                    } while (uVar21 != 0);
                    lVar24 = POPCOUNT(uVar27) + 3;
                    do {
                      auVar44 = vpermi2q_avx512vl(auVar48,auVar42,auVar43);
                      (pSVar23->ptr).ptr = auVar44._0_8_;
                      auVar45 = auVar55._0_32_;
                      auVar44 = vpermd_avx2(auVar45,auVar63);
                      pSVar23->dist = auVar44._0_4_;
                      auVar48 = valignd_avx512vl(auVar45,auVar45,1);
                      pSVar23 = pSVar23 + 1;
                      auVar55 = ZEXT3264(auVar48);
                      lVar24 = lVar24 + -1;
                    } while (lVar24 != 0);
                    auVar42 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                    sVar22 = auVar42._0_8_;
                    in_ZMM8 = ZEXT3264(auVar63);
                    iVar17 = 0;
                  }
                }
              }
            }
          }
        }
        else {
          iVar17 = 6;
        }
      } while (iVar17 == 0);
    } while (iVar17 != 6);
    uVar19 = (ulong)((uint)sVar22 & 0xf);
    if (uVar19 != 8) {
      uVar27 = sVar22 & 0xfffffffffffffff0;
      lVar24 = 0;
      do {
        lVar25 = lVar24 * 0xb0;
        auVar29 = *(undefined1 (*) [16])(uVar27 + 0x80 + lVar25);
        auVar62 = *(undefined1 (*) [16])(uVar27 + 0x40 + lVar25);
        auVar61 = *(undefined1 (*) [16])(uVar27 + 0x70 + lVar25);
        auVar39 = *(undefined1 (*) [16])(uVar27 + 0x50 + lVar25);
        auVar30._0_4_ = auVar62._0_4_ * auVar29._0_4_;
        auVar30._4_4_ = auVar62._4_4_ * auVar29._4_4_;
        auVar30._8_4_ = auVar62._8_4_ * auVar29._8_4_;
        auVar30._12_4_ = auVar62._12_4_ * auVar29._12_4_;
        auVar1 = *(undefined1 (*) [16])(uVar27 + 0x60 + lVar25);
        auVar59 = *(undefined1 (*) [16])(uVar27 + 0x30 + lVar25);
        local_2558 = vfmsub231ps_fma(auVar30,auVar61,auVar39);
        auVar34._0_4_ = auVar39._0_4_ * auVar1._0_4_;
        auVar34._4_4_ = auVar39._4_4_ * auVar1._4_4_;
        auVar34._8_4_ = auVar39._8_4_ * auVar1._8_4_;
        auVar34._12_4_ = auVar39._12_4_ * auVar1._12_4_;
        local_2548 = vfmsub231ps_fma(auVar34,auVar29,auVar59);
        auVar35._0_4_ = auVar59._0_4_ * auVar61._0_4_;
        auVar35._4_4_ = auVar59._4_4_ * auVar61._4_4_;
        auVar35._8_4_ = auVar59._8_4_ * auVar61._8_4_;
        auVar35._12_4_ = auVar59._12_4_ * auVar61._12_4_;
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar38._4_4_ = uVar49;
        auVar38._0_4_ = uVar49;
        auVar38._8_4_ = uVar49;
        auVar38._12_4_ = uVar49;
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar67._4_4_ = uVar49;
        auVar67._0_4_ = uVar49;
        auVar67._8_4_ = uVar49;
        auVar67._12_4_ = uVar49;
        fVar53 = *(float *)(ray + k * 4 + 0x60);
        auVar36._4_4_ = fVar53;
        auVar36._0_4_ = fVar53;
        auVar36._8_4_ = fVar53;
        auVar36._12_4_ = fVar53;
        uVar49 = *(undefined4 *)(ray + k * 4);
        auVar33._4_4_ = uVar49;
        auVar33._0_4_ = uVar49;
        auVar33._8_4_ = uVar49;
        auVar33._12_4_ = uVar49;
        auVar30 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + lVar25),auVar33);
        local_2538 = vfmsub231ps_fma(auVar35,auVar1,auVar62);
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar31._4_4_ = uVar49;
        auVar31._0_4_ = uVar49;
        auVar31._8_4_ = uVar49;
        auVar31._12_4_ = uVar49;
        auVar31 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x10 + lVar25),auVar31);
        uVar49 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar32._4_4_ = uVar49;
        auVar32._0_4_ = uVar49;
        auVar32._8_4_ = uVar49;
        auVar32._12_4_ = uVar49;
        auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + lVar25),auVar32);
        auVar33 = vmulps_avx512vl(auVar67,auVar32);
        auVar34 = vfmsub231ps_avx512vl(auVar33,auVar31,auVar36);
        auVar33 = vmulps_avx512vl(auVar36,auVar30);
        auVar35 = vfmsub231ps_avx512vl(auVar33,auVar32,auVar38);
        auVar33 = vmulps_avx512vl(auVar38,auVar31);
        auVar36 = vfmsub231ps_avx512vl(auVar33,auVar30,auVar67);
        auVar68._0_4_ = fVar53 * local_2538._0_4_;
        auVar68._4_4_ = fVar53 * local_2538._4_4_;
        auVar68._8_4_ = fVar53 * local_2538._8_4_;
        auVar68._12_4_ = fVar53 * local_2538._12_4_;
        auVar33 = vfmadd231ps_fma(auVar68,local_2548,auVar67);
        auVar33 = vfmadd231ps_fma(auVar33,local_2558,auVar38);
        auVar37._8_4_ = 0x7fffffff;
        auVar37._0_8_ = 0x7fffffff7fffffff;
        auVar37._12_4_ = 0x7fffffff;
        auVar37 = vandps_avx512vl(auVar33,auVar37);
        auVar38 = vandps_avx512vl(auVar33,auVar79._0_16_);
        auVar29 = vmulps_avx512vl(auVar29,auVar36);
        auVar29 = vfmadd231ps_avx512vl(auVar29,auVar35,auVar61);
        auVar29 = vfmadd231ps_avx512vl(auVar29,auVar34,auVar1);
        uVar18 = auVar38._0_4_;
        auVar61._0_4_ = (float)(uVar18 ^ auVar29._0_4_);
        uVar64 = auVar38._4_4_;
        auVar61._4_4_ = (float)(uVar64 ^ auVar29._4_4_);
        uVar65 = auVar38._8_4_;
        auVar61._8_4_ = (float)(uVar65 ^ auVar29._8_4_);
        uVar66 = auVar38._12_4_;
        auVar61._12_4_ = (float)(uVar66 ^ auVar29._12_4_);
        auVar29 = vmulps_avx512vl(auVar39,auVar36);
        auVar29 = vfmadd231ps_avx512vl(auVar29,auVar62,auVar35);
        auVar29 = vfmadd231ps_avx512vl(auVar29,auVar59,auVar34);
        auVar62._0_4_ = (float)(uVar18 ^ auVar29._0_4_);
        auVar62._4_4_ = (float)(uVar64 ^ auVar29._4_4_);
        auVar62._8_4_ = (float)(uVar65 ^ auVar29._8_4_);
        auVar62._12_4_ = (float)(uVar66 ^ auVar29._12_4_);
        auVar29 = ZEXT816(0) << 0x20;
        uVar11 = vcmpps_avx512vl(auVar61,auVar29,5);
        uVar8 = vcmpps_avx512vl(auVar62,auVar29,5);
        uVar9 = vcmpps_avx512vl(auVar33,auVar29,4);
        auVar29._0_4_ = auVar62._0_4_ + auVar61._0_4_;
        auVar29._4_4_ = auVar62._4_4_ + auVar61._4_4_;
        auVar29._8_4_ = auVar62._8_4_ + auVar61._8_4_;
        auVar29._12_4_ = auVar62._12_4_ + auVar61._12_4_;
        uVar10 = vcmpps_avx512vl(auVar29,auVar37,2);
        bVar26 = (byte)uVar11 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
        if (bVar26 != 0) {
          auVar60._0_4_ = local_2538._0_4_ * auVar32._0_4_;
          auVar60._4_4_ = local_2538._4_4_ * auVar32._4_4_;
          auVar60._8_4_ = local_2538._8_4_ * auVar32._8_4_;
          auVar60._12_4_ = local_2538._12_4_ * auVar32._12_4_;
          auVar29 = vfmadd213ps_fma(auVar31,local_2548,auVar60);
          auVar29 = vfmadd213ps_fma(auVar30,local_2558,auVar29);
          auVar59._0_4_ = (float)(uVar18 ^ auVar29._0_4_);
          auVar59._4_4_ = (float)(uVar64 ^ auVar29._4_4_);
          auVar59._8_4_ = (float)(uVar65 ^ auVar29._8_4_);
          auVar59._12_4_ = (float)(uVar66 ^ auVar29._12_4_);
          uVar49 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar39._4_4_ = uVar49;
          auVar39._0_4_ = uVar49;
          auVar39._8_4_ = uVar49;
          auVar39._12_4_ = uVar49;
          auVar29 = vmulps_avx512vl(auVar37,auVar39);
          uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar1._4_4_ = uVar49;
          auVar1._0_4_ = uVar49;
          auVar1._8_4_ = uVar49;
          auVar1._12_4_ = uVar49;
          auVar39 = vmulps_avx512vl(auVar37,auVar1);
          uVar11 = vcmpps_avx512vl(auVar59,auVar39,2);
          uVar8 = vcmpps_avx512vl(auVar29,auVar59,1);
          bVar26 = (byte)uVar11 & (byte)uVar8 & bVar26;
          if (bVar26 != 0) {
            local_2618 = context->scene;
            auVar29 = vrcp14ps_avx512vl(auVar37);
            auVar12._8_4_ = 0x3f800000;
            auVar12._0_8_ = &DAT_3f8000003f800000;
            auVar12._12_4_ = 0x3f800000;
            auVar39 = vfnmadd213ps_avx512vl(auVar37,auVar29,auVar12);
            auVar29 = vfmadd132ps_fma(auVar39,auVar29,auVar29);
            fVar53 = auVar29._0_4_;
            local_2568._0_4_ = fVar53 * auVar59._0_4_;
            fVar56 = auVar29._4_4_;
            local_2568._4_4_ = fVar56 * auVar59._4_4_;
            fVar57 = auVar29._8_4_;
            local_2568._8_4_ = fVar57 * auVar59._8_4_;
            fVar58 = auVar29._12_4_;
            local_2568._12_4_ = fVar58 * auVar59._12_4_;
            auVar52 = ZEXT1664(local_2568);
            local_2588[0] = fVar53 * auVar61._0_4_;
            local_2588[1] = fVar56 * auVar61._4_4_;
            local_2588[2] = fVar57 * auVar61._8_4_;
            local_2588[3] = fVar58 * auVar61._12_4_;
            local_2578[0] = fVar53 * auVar62._0_4_;
            local_2578[1] = fVar56 * auVar62._4_4_;
            local_2578[2] = fVar57 * auVar62._8_4_;
            local_2578[3] = fVar58 * auVar62._12_4_;
            lVar25 = lVar25 + uVar27;
            auVar50._8_4_ = 0x7f800000;
            auVar50._0_8_ = 0x7f8000007f800000;
            auVar50._12_4_ = 0x7f800000;
            auVar29 = vblendmps_avx512vl(auVar50,local_2568);
            auVar40._0_4_ =
                 (uint)(bVar26 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
            bVar6 = (bool)(bVar26 >> 1 & 1);
            auVar40._4_4_ = (uint)bVar6 * auVar29._4_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar26 >> 2 & 1);
            auVar40._8_4_ = (uint)bVar6 * auVar29._8_4_ | (uint)!bVar6 * 0x7f800000;
            bVar6 = (bool)(bVar26 >> 3 & 1);
            auVar40._12_4_ = (uint)bVar6 * auVar29._12_4_ | (uint)!bVar6 * 0x7f800000;
            auVar29 = vshufps_avx(auVar40,auVar40,0xb1);
            auVar29 = vminps_avx(auVar29,auVar40);
            auVar62 = vshufpd_avx(auVar29,auVar29,1);
            auVar29 = vminps_avx(auVar62,auVar29);
            uVar11 = vcmpps_avx512vl(auVar40,auVar29,0);
            uVar18 = (uint)bVar26;
            uVar64 = (uint)((byte)uVar11 & bVar26);
            if (((byte)uVar11 & bVar26) == 0) {
              uVar64 = uVar18;
            }
            uVar21 = 0;
            for (uVar28 = (ulong)uVar64; (uVar28 & 1) == 0;
                uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              uVar21 = uVar21 + 1;
            }
            do {
              uVar64 = *(uint *)(lVar25 + 0x90 + uVar21 * 4);
              pGVar2 = (local_2618->geometries).items[uVar64].ptr;
              local_2678 = (byte)uVar18;
              if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar28 = (ulong)(~(byte)(1 << ((uint)uVar21 & 0x1f)) & local_2678);
                bVar6 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar6 = false;
                uVar28 = (ulong)uVar18;
              }
              else {
                local_2528 = auVar52._0_16_;
                auVar42 = vmovdqu64_avx512vl(auVar75._0_32_);
                fVar53 = local_2588[uVar21];
                h.u.field_0.i[1] = (int)fVar53;
                h.u.field_0.i[0] = (int)fVar53;
                h.u.field_0.i[2] = (int)fVar53;
                h.u.field_0.i[3] = (int)fVar53;
                h.v.field_0.v[0] = local_2578[uVar21];
                h.geomID.field_0 =
                     (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
                uVar49 = *(undefined4 *)(lVar25 + 0xa0 + uVar21 * 4);
                h.primID.field_0.i[1] = uVar49;
                h.primID.field_0.i[0] = uVar49;
                h.primID.field_0.i[2] = uVar49;
                h.primID.field_0.i[3] = uVar49;
                h.Ng.field_0._0_4_ = *(undefined4 *)(local_2558 + uVar21 * 4);
                uVar49 = *(undefined4 *)(local_2548 + uVar21 * 4);
                h.Ng.field_0._20_4_ = uVar49;
                h.Ng.field_0._16_4_ = uVar49;
                h.Ng.field_0._24_4_ = uVar49;
                h.Ng.field_0._28_4_ = uVar49;
                uVar49 = *(undefined4 *)(local_2538 + uVar21 * 4);
                h.Ng.field_0._36_4_ = uVar49;
                h.Ng.field_0._32_4_ = uVar49;
                h.Ng.field_0._40_4_ = uVar49;
                h.Ng.field_0._44_4_ = uVar49;
                h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                              ZEXT1632((undefined1  [16])h.u.field_0));
                h.instID[0].field_0.i[1] = context->user->instID[0];
                h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2568 + uVar21 * 4);
                local_2518 = vmovdqa64_avx512vl(auVar76._0_16_);
                local_2648 = vmovdqa64_avx512vl(auVar76._0_16_);
                args.valid = (int *)local_2648;
                args.geometryUserPtr = pGVar2->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar2->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar2->intersectionFilterN)(&args);
                }
                uVar28 = vptestmd_avx512vl(local_2648,local_2648);
                if ((uVar28 & 0xf) == 0) {
LAB_0082db9c:
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar49;
                }
                else {
                  p_Var3 = context->args->filter;
                  if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var3)(&args);
                  }
                  uVar28 = vptestmd_avx512vl(local_2648,local_2648);
                  uVar28 = uVar28 & 0xf;
                  bVar26 = (byte)uVar28;
                  if (bVar26 == 0) goto LAB_0082db9c;
                  iVar17 = *(int *)(args.hit + 4);
                  iVar14 = *(int *)(args.hit + 8);
                  iVar15 = *(int *)(args.hit + 0xc);
                  bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                  bVar5 = SUB81(uVar28 >> 3,0);
                  *(uint *)(args.ray + 0xc0) =
                       (uint)(bVar26 & 1) * *(int *)args.hit |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xc0);
                  *(uint *)(args.ray + 0xc4) =
                       (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xc4);
                  *(uint *)(args.ray + 200) =
                       (uint)bVar4 * iVar14 | (uint)!bVar4 * *(int *)(args.ray + 200);
                  *(uint *)(args.ray + 0xcc) =
                       (uint)bVar5 * iVar15 | (uint)!bVar5 * *(int *)(args.ray + 0xcc);
                  iVar17 = *(int *)(args.hit + 0x14);
                  iVar14 = *(int *)(args.hit + 0x18);
                  iVar15 = *(int *)(args.hit + 0x1c);
                  bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                  bVar5 = SUB81(uVar28 >> 3,0);
                  *(uint *)(args.ray + 0xd0) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x10) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xd0);
                  *(uint *)(args.ray + 0xd4) =
                       (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xd4);
                  *(uint *)(args.ray + 0xd8) =
                       (uint)bVar4 * iVar14 | (uint)!bVar4 * *(int *)(args.ray + 0xd8);
                  *(uint *)(args.ray + 0xdc) =
                       (uint)bVar5 * iVar15 | (uint)!bVar5 * *(int *)(args.ray + 0xdc);
                  iVar17 = *(int *)(args.hit + 0x24);
                  iVar14 = *(int *)(args.hit + 0x28);
                  iVar15 = *(int *)(args.hit + 0x2c);
                  bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                  bVar5 = SUB81(uVar28 >> 3,0);
                  *(uint *)(args.ray + 0xe0) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x20) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xe0);
                  *(uint *)(args.ray + 0xe4) =
                       (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xe4);
                  *(uint *)(args.ray + 0xe8) =
                       (uint)bVar4 * iVar14 | (uint)!bVar4 * *(int *)(args.ray + 0xe8);
                  *(uint *)(args.ray + 0xec) =
                       (uint)bVar5 * iVar15 | (uint)!bVar5 * *(int *)(args.ray + 0xec);
                  iVar17 = *(int *)(args.hit + 0x34);
                  iVar14 = *(int *)(args.hit + 0x38);
                  iVar15 = *(int *)(args.hit + 0x3c);
                  bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                  bVar5 = SUB81(uVar28 >> 3,0);
                  *(uint *)(args.ray + 0xf0) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x30) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0xf0);
                  *(uint *)(args.ray + 0xf4) =
                       (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0xf4);
                  *(uint *)(args.ray + 0xf8) =
                       (uint)bVar4 * iVar14 | (uint)!bVar4 * *(int *)(args.ray + 0xf8);
                  *(uint *)(args.ray + 0xfc) =
                       (uint)bVar5 * iVar15 | (uint)!bVar5 * *(int *)(args.ray + 0xfc);
                  iVar17 = *(int *)(args.hit + 0x44);
                  iVar14 = *(int *)(args.hit + 0x48);
                  iVar15 = *(int *)(args.hit + 0x4c);
                  bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar28 >> 2) & 1);
                  bVar5 = SUB81(uVar28 >> 3,0);
                  *(uint *)(args.ray + 0x100) =
                       (uint)(bVar26 & 1) * *(int *)(args.hit + 0x40) |
                       (uint)!(bool)(bVar26 & 1) * *(uint *)(args.ray + 0x100);
                  *(uint *)(args.ray + 0x104) =
                       (uint)bVar6 * iVar17 | (uint)!bVar6 * *(int *)(args.ray + 0x104);
                  *(uint *)(args.ray + 0x108) =
                       (uint)bVar4 * iVar14 | (uint)!bVar4 * *(int *)(args.ray + 0x108);
                  *(uint *)(args.ray + 0x10c) =
                       (uint)bVar5 * iVar15 | (uint)!bVar5 * *(int *)(args.ray + 0x10c);
                  auVar29 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar29;
                  auVar29 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar29;
                  auVar29 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar29;
                  auVar29 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar29;
                }
                auVar52 = ZEXT1664(local_2528);
                uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar13._4_4_ = uVar49;
                auVar13._0_4_ = uVar49;
                auVar13._8_4_ = uVar49;
                auVar13._12_4_ = uVar49;
                uVar11 = vcmpps_avx512vl(local_2528,auVar13,2);
                uVar28 = (ulong)(byte)(~(byte)(1 << ((uint)uVar21 & 0x1f)) & local_2678 &
                                      (byte)uVar11);
                bVar6 = true;
                auVar69 = ZEXT3264(auVar69._0_32_);
                auVar70 = ZEXT3264(auVar70._0_32_);
                auVar71 = ZEXT3264(auVar71._0_32_);
                auVar72 = ZEXT3264(auVar72._0_32_);
                auVar73 = ZEXT3264(auVar73._0_32_);
                auVar74 = ZEXT3264(auVar74._0_32_);
                auVar42 = vmovdqu64_avx512vl(auVar42);
                auVar75 = ZEXT3264(auVar42);
                auVar29 = vmovdqa64_avx512vl(local_2518);
                auVar76 = ZEXT1664(auVar29);
                auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar77 = ZEXT3264(auVar42);
                auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar78 = ZEXT3264(auVar42);
                auVar29 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar79 = ZEXT1664(auVar29);
                auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar80 = ZEXT3264(auVar42);
                auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                auVar81 = ZEXT3264(auVar42);
              }
              if (!bVar6) {
                fVar53 = local_2588[uVar21];
                fVar56 = local_2578[uVar21];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2568 + uVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2558 + uVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2548 + uVar21 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2538 + uVar21 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar53;
                *(float *)(ray + k * 4 + 0x100) = fVar56;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar25 + 0xa0 + uVar21 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar64;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              bVar26 = (byte)uVar28;
              if (bVar26 == 0) break;
              uVar18 = (uint)uVar28;
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar29 = vblendmps_avx512vl(auVar51,auVar52._0_16_);
              auVar41._0_4_ =
                   (uint)(bVar26 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
              bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
              auVar41._4_4_ = (uint)bVar6 * auVar29._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
              auVar41._8_4_ = (uint)bVar6 * auVar29._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)((byte)(uVar28 >> 3) & 1);
              auVar41._12_4_ = (uint)bVar6 * auVar29._12_4_ | (uint)!bVar6 * 0x7f800000;
              auVar29 = vshufps_avx(auVar41,auVar41,0xb1);
              auVar29 = vminps_avx(auVar29,auVar41);
              auVar62 = vshufpd_avx(auVar29,auVar29,1);
              auVar29 = vminps_avx(auVar62,auVar29);
              uVar11 = vcmpps_avx512vl(auVar41,auVar29,0);
              bVar26 = (byte)uVar11 & bVar26;
              uVar64 = uVar18;
              if (bVar26 != 0) {
                uVar64 = (uint)bVar26;
              }
              uVar65 = 0;
              for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
                uVar65 = uVar65 + 1;
              }
              uVar21 = (ulong)uVar65;
            } while( true );
          }
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != uVar19 - 8);
    }
    uVar49 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar52 = ZEXT3264(CONCAT428(uVar49,CONCAT424(uVar49,CONCAT420(uVar49,CONCAT416(uVar49,CONCAT412
                                                  (uVar49,CONCAT48(uVar49,CONCAT44(uVar49,uVar49))))
                                                  ))));
    in_ZMM8 = ZEXT3264(in_ZMM8._0_32_);
    uVar19 = local_2610;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }